

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SeparationPart.cpp
# Opt level: O1

void __thiscall KDIS::DATA_TYPE::SeparationPart::Encode(SeparationPart *this,KDataStream *stream)

{
  KDataStream::Write(stream,(this->super_VariableParameter).m_ui8VarParamType);
  KDataStream::Write(stream,this->m_ui8Reason);
  KDataStream::Write(stream,this->m_ui8PreEntIndicator);
  KDataStream::Write(stream,this->m_ui8Padding);
  (*(this->m_ParentEntId).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_ParentEntId,stream);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16Padding);
  (*(this->m_StationLoc).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_StationLoc,stream);
  return;
}

Assistant:

void SeparationPart::Encode( KDataStream & stream ) const
{
    stream << m_ui8VarParamType
           << m_ui8Reason
           << m_ui8PreEntIndicator
           << m_ui8Padding
           << KDIS_STREAM m_ParentEntId
           << m_ui16Padding
           << KDIS_STREAM m_StationLoc;
}